

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void log_access(mg_connection *conn)

{
  int iVar1;
  int iVar2;
  int iVar3;
  tm *__tp;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *local_1170;
  char *local_1158;
  char *local_1148;
  char *local_1130;
  char local_1108 [4];
  int ok;
  char log_buf [4096];
  char *user_agent;
  char *referer;
  tm *tm;
  char src_addr [50];
  char local_a8 [8];
  char date [64];
  mg_file fi;
  mg_request_info *ri;
  mg_connection *conn_local;
  
  if ((conn != (mg_connection *)0x0) && (conn->dom_ctx != (mg_domain_context *)0x0)) {
    local_1108[0] = '\0';
    if (conn->dom_ctx->config[0x10] == (char *)0x0) {
      fi.stat.location = 0;
      fi.stat._28_4_ = 0;
    }
    else {
      iVar1 = mg_fopen(conn,conn->dom_ctx->config[0x10],4,(mg_file *)(date + 0x38));
      if (iVar1 == 0) {
        fi.stat.location = 0;
        fi.stat._28_4_ = 0;
      }
    }
    if ((fi.stat._24_8_ != 0) ||
       ((conn->phys_ctx->callbacks).log_access != (_func_int_mg_connection_ptr_char_ptr *)0x0)) {
      if (local_1108[0] == '\0') {
        __tp = localtime(&conn->conn_birth_time);
        if (__tp == (tm *)0x0) {
          mg_strlcpy(local_a8,"01/Jan/1970:00:00:00 +0000",0x40);
        }
        else {
          strftime(local_a8,0x40,"%d/%b/%Y:%H:%M:%S %z",__tp);
        }
        fi.access.fp = (FILE *)&conn->request_info;
        sockaddr_to_string((char *)&tm,0x32,&(conn->client).rsa);
        pcVar4 = header_val(conn,"Referer");
        pcVar5 = header_val(conn,"User-Agent");
        if ((fi.access.fp)->_IO_write_end == (char *)0x0) {
          local_1130 = "-";
        }
        else {
          local_1130 = (fi.access.fp)->_IO_write_end;
        }
        if (*(long *)fi.access.fp == 0) {
          local_1148 = "-";
        }
        else {
          local_1148 = *(char **)fi.access.fp;
        }
        if ((fi.access.fp)->_IO_read_ptr == (char *)0x0) {
          local_1158 = "-";
        }
        else {
          local_1158 = (fi.access.fp)->_IO_read_ptr;
        }
        pcVar6 = "";
        if ((fi.access.fp)->_IO_write_ptr != (char *)0x0) {
          pcVar6 = "?";
        }
        if ((fi.access.fp)->_IO_write_ptr == (char *)0x0) {
          local_1170 = "";
        }
        else {
          local_1170 = (fi.access.fp)->_IO_write_ptr;
        }
        mg_snprintf(conn,(int *)0x0,local_1108,0x1000,
                    "%s - %s [%s] \"%s %s%s%s HTTP/%s\" %d %ld %s %s",&tm,local_1130,local_a8,
                    local_1148,local_1158,pcVar6,local_1170,(fi.access.fp)->_IO_write_base,
                    conn->status_code,conn->num_bytes_sent,pcVar4,pcVar5);
      }
      if (((conn->phys_ctx->callbacks).log_access == (_func_int_mg_connection_ptr_char_ptr *)0x0) ||
         (iVar1 = (*(conn->phys_ctx->callbacks).log_access)(conn,local_1108), iVar1 == 0)) {
        if (fi.stat._24_8_ != 0) {
          flockfile((FILE *)fi.stat._24_8_);
          iVar1 = fprintf((FILE *)fi.stat._24_8_,"%s\n",local_1108);
          iVar2 = fflush((FILE *)fi.stat._24_8_);
          funlockfile((FILE *)fi.stat._24_8_);
          iVar3 = mg_fclose((mg_file_access *)&fi.stat.location);
          if (iVar3 != 0 || (iVar2 != 0 || iVar1 < 1)) {
            mg_cry_internal_wrap
                      (conn,(mg_context *)0x0,"log_access",0x3f58,"Error writing log file %s",
                       conn->dom_ctx->config[0x10]);
          }
        }
      }
      else if (fi.stat._24_8_ != 0) {
        mg_fclose((mg_file_access *)&fi.stat.location);
      }
    }
  }
  return;
}

Assistant:

static void
log_access(const struct mg_connection *conn)
{
	const struct mg_request_info *ri;
	struct mg_file fi;
	char date[64], src_addr[IP_ADDR_STR_LEN];
#if defined(REENTRANT_TIME)
	struct tm _tm;
	struct tm *tm = &_tm;
#else
	struct tm *tm;
#endif

	const char *referer;
	const char *user_agent;

	char log_buf[4096];

	if (!conn || !conn->dom_ctx) {
		return;
	}

	/* Set log message to "empty" */
	log_buf[0] = 0;

#if defined(USE_LUA)
	if (conn->phys_ctx->lua_bg_log_available) {
		int ret;
		struct mg_context *ctx = conn->phys_ctx;
		lua_State *lstate = (lua_State *)ctx->lua_background_state;
		pthread_mutex_lock(&ctx->lua_bg_mutex);
		/* call "log()" in Lua */
		lua_getglobal(lstate, "log");
		prepare_lua_request_info_inner(conn, lstate);
		push_lua_response_log_data(conn, lstate);

		ret = lua_pcall(lstate, /* args */ 2, /* results */ 1, 0);
		if (ret == 0) {
			int t = lua_type(lstate, -1);
			if (t == LUA_TBOOLEAN) {
				if (lua_toboolean(lstate, -1) == 0) {
					/* log() returned false: do not log */
					pthread_mutex_unlock(&ctx->lua_bg_mutex);
					return;
				}
				/* log returned true: continue logging */
			} else if (t == LUA_TSTRING) {
				size_t len;
				const char *txt = lua_tolstring(lstate, -1, &len);
				if ((len == 0) || (*txt == 0)) {
					/* log() returned empty string: do not log */
					pthread_mutex_unlock(&ctx->lua_bg_mutex);
					return;
				}
				/* Copy test from Lua into log_buf */
				if (len >= sizeof(log_buf)) {
					len = sizeof(log_buf) - 1;
				}
				memcpy(log_buf, txt, len);
				log_buf[len] = 0;
			}
		} else {
			lua_cry(conn, ret, lstate, "lua_background_script", "log");
		}
		pthread_mutex_unlock(&ctx->lua_bg_mutex);
	}
#endif

	if (conn->dom_ctx->config[ACCESS_LOG_FILE] != NULL) {
		if (mg_fopen(conn,
		             conn->dom_ctx->config[ACCESS_LOG_FILE],
		             MG_FOPEN_MODE_APPEND,
		             &fi)
		    == 0) {
			fi.access.fp = NULL;
		}
	} else {
		fi.access.fp = NULL;
	}

	/* Log is written to a file and/or a callback. If both are not set,
	 * executing the rest of the function is pointless. */
	if ((fi.access.fp == NULL)
	    && (conn->phys_ctx->callbacks.log_access == NULL)) {
		return;
	}

	/* If we did not get a log message from Lua, create it here. */
	if (!log_buf[0]) {
#if defined(REENTRANT_TIME)
		localtime_r(&conn->conn_birth_time, tm);
#else
		tm = localtime(&conn->conn_birth_time);
#endif
		if (tm != NULL) {
			strftime(date, sizeof(date), "%d/%b/%Y:%H:%M:%S %z", tm);
		} else {
			mg_strlcpy(date, "01/Jan/1970:00:00:00 +0000", sizeof(date));
		}

		ri = &conn->request_info;

		sockaddr_to_string(src_addr, sizeof(src_addr), &conn->client.rsa);
		referer = header_val(conn, "Referer");
		user_agent = header_val(conn, "User-Agent");

		mg_snprintf(conn,
		            NULL, /* Ignore truncation in access log */
		            log_buf,
		            sizeof(log_buf),
		            "%s - %s [%s] \"%s %s%s%s HTTP/%s\" %d %" INT64_FMT
		            " %s %s",
		            src_addr,
		            (ri->remote_user == NULL) ? "-" : ri->remote_user,
		            date,
		            ri->request_method ? ri->request_method : "-",
		            ri->request_uri ? ri->request_uri : "-",
		            ri->query_string ? "?" : "",
		            ri->query_string ? ri->query_string : "",
		            ri->http_version,
		            conn->status_code,
		            conn->num_bytes_sent,
		            referer,
		            user_agent);
	}

	/* Here we have a log message in log_buf. Call the callback */
	if (conn->phys_ctx->callbacks.log_access) {
		if (conn->phys_ctx->callbacks.log_access(conn, log_buf)) {
			/* do not log if callback returns non-zero */
			if (fi.access.fp) {
				mg_fclose(&fi.access);
			}
			return;
		}
	}

	/* Store in file */
	if (fi.access.fp) {
		int ok = 1;
		flockfile(fi.access.fp);
		if (fprintf(fi.access.fp, "%s\n", log_buf) < 1) {
			ok = 0;
		}
		if (fflush(fi.access.fp) != 0) {
			ok = 0;
		}
		funlockfile(fi.access.fp);
		if (mg_fclose(&fi.access) != 0) {
			ok = 0;
		}
		if (!ok) {
			mg_cry_internal(conn,
			                "Error writing log file %s",
			                conn->dom_ctx->config[ACCESS_LOG_FILE]);
		}
	}
}